

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.h
# Opt level: O2

void __thiscall
gpu::ConvolutionFilters<unsigned_char>::applyConvolution
          (ConvolutionFilters<unsigned_char> *this,uchar *inputBuffer,uchar *outputBuffer,
          int *kernel,int imageWidth,int imageHeight,int kernelSize,int normal,int offset,
          int channel)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  iVar3 = offset + ~imageWidth * (kernelSize / 2) + -1;
  iVar2 = 0;
  iVar6 = 0;
  iVar4 = 1;
  for (uVar5 = 0; (uint)(kernelSize * kernelSize) != uVar5; uVar5 = uVar5 + 1) {
    bVar7 = iVar4 == kernelSize;
    iVar4 = iVar4 + 1;
    iVar1 = 1;
    if (bVar7) {
      iVar4 = 2;
      iVar1 = imageWidth - kernelSize;
    }
    iVar3 = iVar3 + iVar1;
    if ((channel * imageWidth * imageHeight < iVar3) &&
       (iVar3 < (channel * imageWidth + imageWidth) * imageHeight)) {
      iVar2 = iVar2 + (uint)inputBuffer[iVar3] * kernel[uVar5];
      iVar6 = iVar6 + kernel[uVar5];
    }
  }
  iVar2 = iVar2 / (int)(iVar6 + (uint)(iVar6 == 0));
  iVar4 = 0;
  if (0 < iVar2) {
    iVar4 = iVar2;
  }
  if (0xfe < iVar4) {
    iVar4 = 0xff;
  }
  outputBuffer[offset] = (uchar)iVar4;
  return;
}

Assistant:

FUNCTION_PREFIX void ConvolutionFilters<T>::applyConvolution(T* inputBuffer, 
                                                                 T* outputBuffer,
                                                                 int* kernel,
                                                                 int imageWidth,
                                                                 int imageHeight,
                                                                 int kernelSize,
                                                                 int normal,
                                                                 int offset,
                                                                 int channel)
    {
      int startingOffset=offset-(imageWidth*(kernelSize/2))-kernelSize/2;
      int boundaryBase  =channel*imageWidth*imageHeight;
      int boundaryLimit =channel*imageWidth*imageHeight+imageWidth*imageHeight;

      int sum=0;
      int count=0;
      int _offset=startingOffset-1;
      int calc=1;
      for (int c=1;c<=kernelSize*kernelSize;c++)
      {
        if(calc==kernelSize) {_offset+=(imageWidth-kernelSize); calc=1;}
        else _offset+=1;
        if (_offset>boundaryBase && _offset<boundaryLimit)
        {
          sum+=inputBuffer[_offset]*kernel[c-1];
          count+=kernel[c-1];
        }
        calc+=1;
      }
      if (count==0)count=1;
      sum=sum/count;
      PIXEL_DOMAIN_CHECK(sum);
      outputBuffer[offset]=sum;

    }